

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::CreateRawPeginRequest::CreateRawPeginRequest(CreateRawPeginRequest *this)

{
  CreateRawPeginRequest *this_local;
  
  core::JsonClassBase<cfd::js::api::json::CreateRawPeginRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::CreateRawPeginRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::CreateRawPeginRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__CreateRawPeginRequest_01b4e840;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  this->version_ = 2;
  this->locktime_ = 0;
  core::
  JsonObjectVector<cfd::js::api::json::ElementsPeginTxIn,_cfd::js::api::ElementsPeginTxInStruct>::
  JsonObjectVector(&this->txins_);
  core::JsonObjectVector<cfd::js::api::json::ElementsTxOut,_cfd::js::api::ElementsTxOutStruct>::
  JsonObjectVector(&this->txouts_);
  ElementsTxOutFee::ElementsTxOutFee(&this->fee_);
  this->is_random_sort_tx_out_ = false;
  CollectFieldName();
  return;
}

Assistant:

CreateRawPeginRequest() {
    CollectFieldName();
  }